

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O1

void mouse_button_callback(GLFWwindow *window,int button,int action,int mods)

{
  if (button != 0) {
    return;
  }
  if (action == 1) {
    glfwSetInputMode(window,0x33001,0x34003);
    glfwGetCursorPos(window,&cursorX,&cursorY);
    return;
  }
  glfwSetInputMode(window,0x33001,0x34001);
  return;
}

Assistant:

void mouse_button_callback(GLFWwindow* window, int button, int action, int mods)
{
    if (button != GLFW_MOUSE_BUTTON_LEFT)
        return;

    if (action == GLFW_PRESS)
    {
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
        glfwGetCursorPos(window, &cursorX, &cursorY);
    }
    else
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
}